

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ArrayNewFixed * __thiscall
wasm::Builder::makeArrayNewFixed<std::initializer_list<wasm::Expression*>>
          (Builder *this,HeapType type,initializer_list<wasm::Expression_*> *values)

{
  uintptr_t in_RAX;
  ArrayNewFixed *pAVar1;
  Type local_28;
  
  local_28.id = in_RAX;
  pAVar1 = MixedArena::alloc<wasm::ArrayNewFixed>(&this->wasm->allocator);
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::initializer_list<wasm::Expression*>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pAVar1->values,
             values);
  Type::Type(&local_28,type,NonNullable,Inexact);
  (pAVar1->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id =
       local_28.id;
  ::wasm::ArrayNewFixed::finalize();
  return pAVar1;
}

Assistant:

ArrayNewFixed* makeArrayNewFixed(HeapType type, const T& values) {
    auto* ret = wasm.allocator.alloc<ArrayNewFixed>();
    ret->values.set(values);
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }